

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O1

int test_crop_4(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int in_ECX;
  int in_EDX;
  uint uVar9;
  Mat a;
  Mat local_678;
  Mat local_638;
  Mat local_5f8;
  Mat local_5b8;
  Mat local_578;
  Mat local_538;
  Mat local_4f8;
  Mat local_4b8;
  Mat local_478;
  Mat local_438;
  Mat local_3f8;
  Mat local_3b8;
  Mat local_378;
  Mat local_338;
  Mat local_2f8;
  Mat local_2b8;
  Mat local_278;
  Mat local_238;
  Mat local_1f8;
  Mat local_1b8;
  Mat local_178;
  Mat local_138;
  Mat local_f8;
  Mat local_b8;
  Mat local_78;
  
  RandomMat(&local_678,0x11,in_EDX,in_ECX);
  IntArrayMat(&local_78,0,0,0);
  IntArrayMat(&local_b8,100,100,100);
  IntArrayMat(&local_f8,0,1,2);
  iVar7 = test_crop(&local_678,&local_78,&local_b8,&local_f8);
  if (iVar7 == 0) {
    IntArrayMat(&local_138,4);
    IntArrayMat(&local_178,8);
    IntArrayMat(&local_1b8,0);
    iVar8 = test_crop(&local_678,&local_138,&local_178,&local_1b8);
    if (iVar8 != 0) goto LAB_00113dfc;
    IntArrayMat(&local_1f8,2);
    IntArrayMat(&local_238,7);
    IntArrayMat(&local_278,1);
    iVar8 = test_crop(&local_678,&local_1f8,&local_238,&local_278);
    if (iVar8 != 0) {
      bVar6 = true;
      goto LAB_00113e04;
    }
    IntArrayMat(&local_2b8,3);
    IntArrayMat(&local_2f8,5);
    IntArrayMat(&local_338,2);
    iVar8 = test_crop(&local_678,&local_2b8,&local_2f8,&local_338);
    if (iVar8 != 0) {
      bVar6 = true;
      bVar5 = true;
      goto LAB_00113e0a;
    }
    IntArrayMat(&local_378,2,1);
    IntArrayMat(&local_3b8,4,-2);
    IntArrayMat(&local_3f8,0,1);
    iVar8 = test_crop(&local_678,&local_378,&local_3b8,&local_3f8);
    if (iVar8 != 0) {
      bVar6 = true;
      bVar5 = true;
      bVar4 = true;
      goto LAB_00113e0d;
    }
    IntArrayMat(&local_438,1,4);
    IntArrayMat(&local_478,-5,7);
    IntArrayMat(&local_4b8,1,-3);
    iVar8 = test_crop(&local_678,&local_438,&local_478,&local_4b8);
    if (iVar8 == 0) {
      IntArrayMat(&local_4f8,2,1);
      IntArrayMat(&local_538,4,-2);
      IntArrayMat(&local_578,-1,-2);
      iVar8 = test_crop(&local_678,&local_4f8,&local_538,&local_578);
      if (iVar8 == 0) {
        IntArrayMat(&local_5b8,1,2,3);
        IntArrayMat(&local_5f8,-3,-2,-1);
        IntArrayMat(&local_638,-3,-2,-1);
        iVar8 = test_crop(&local_678,&local_5b8,&local_5f8,&local_638);
        uVar9 = (uint)(iVar8 != 0);
        bVar6 = true;
        bVar5 = true;
        bVar4 = true;
        bVar3 = true;
        bVar2 = true;
        bVar1 = true;
      }
      else {
        uVar9 = 1;
        bVar6 = true;
        bVar1 = false;
        bVar5 = true;
        bVar4 = true;
        bVar3 = true;
        bVar2 = true;
      }
      goto LAB_00113e11;
    }
    bVar6 = true;
    bVar5 = true;
    bVar4 = true;
    bVar3 = true;
  }
  else {
LAB_00113dfc:
    bVar6 = false;
LAB_00113e04:
    bVar5 = false;
LAB_00113e0a:
    bVar4 = false;
LAB_00113e0d:
    bVar3 = false;
  }
  bVar2 = false;
  uVar9 = 1;
  bVar1 = false;
LAB_00113e11:
  if (bVar1) {
    if (local_638.refcount != (int *)0x0) {
      LOCK();
      *local_638.refcount = *local_638.refcount + -1;
      UNLOCK();
      if (*local_638.refcount == 0) {
        if (local_638.allocator == (Allocator *)0x0) {
          if (local_638.data != (void *)0x0) {
            free(local_638.data);
          }
        }
        else {
          (**(code **)(*(long *)local_638.allocator + 0x18))();
        }
      }
    }
    if (local_5f8.refcount != (int *)0x0) {
      LOCK();
      *local_5f8.refcount = *local_5f8.refcount + -1;
      UNLOCK();
      if (*local_5f8.refcount == 0) {
        if (local_5f8.allocator == (Allocator *)0x0) {
          if (local_5f8.data != (void *)0x0) {
            free(local_5f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_5f8.allocator + 0x18))();
        }
      }
    }
    if (local_5b8.refcount != (int *)0x0) {
      LOCK();
      *local_5b8.refcount = *local_5b8.refcount + -1;
      UNLOCK();
      if (*local_5b8.refcount == 0) {
        if (local_5b8.allocator == (Allocator *)0x0) {
          if (local_5b8.data != (void *)0x0) {
            free(local_5b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_5b8.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar2) {
    if (local_578.refcount != (int *)0x0) {
      LOCK();
      *local_578.refcount = *local_578.refcount + -1;
      UNLOCK();
      if (*local_578.refcount == 0) {
        if (local_578.allocator == (Allocator *)0x0) {
          if (local_578.data != (void *)0x0) {
            free(local_578.data);
          }
        }
        else {
          (**(code **)(*(long *)local_578.allocator + 0x18))();
        }
      }
    }
    if (local_538.refcount != (int *)0x0) {
      LOCK();
      *local_538.refcount = *local_538.refcount + -1;
      UNLOCK();
      if (*local_538.refcount == 0) {
        if (local_538.allocator == (Allocator *)0x0) {
          if (local_538.data != (void *)0x0) {
            free(local_538.data);
          }
        }
        else {
          (**(code **)(*(long *)local_538.allocator + 0x18))();
        }
      }
    }
    if (local_4f8.refcount != (int *)0x0) {
      LOCK();
      *local_4f8.refcount = *local_4f8.refcount + -1;
      UNLOCK();
      if (*local_4f8.refcount == 0) {
        if (local_4f8.allocator == (Allocator *)0x0) {
          if (local_4f8.data != (void *)0x0) {
            free(local_4f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_4f8.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar3) {
    if (local_4b8.refcount != (int *)0x0) {
      LOCK();
      *local_4b8.refcount = *local_4b8.refcount + -1;
      UNLOCK();
      if (*local_4b8.refcount == 0) {
        if (local_4b8.allocator == (Allocator *)0x0) {
          if (local_4b8.data != (void *)0x0) {
            free(local_4b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_4b8.allocator + 0x18))();
        }
      }
    }
    if (local_478.refcount != (int *)0x0) {
      LOCK();
      *local_478.refcount = *local_478.refcount + -1;
      UNLOCK();
      if (*local_478.refcount == 0) {
        if (local_478.allocator == (Allocator *)0x0) {
          if (local_478.data != (void *)0x0) {
            free(local_478.data);
          }
        }
        else {
          (**(code **)(*(long *)local_478.allocator + 0x18))();
        }
      }
    }
    if (local_438.refcount != (int *)0x0) {
      LOCK();
      *local_438.refcount = *local_438.refcount + -1;
      UNLOCK();
      if (*local_438.refcount == 0) {
        if (local_438.allocator == (Allocator *)0x0) {
          if (local_438.data != (void *)0x0) {
            free(local_438.data);
          }
        }
        else {
          (**(code **)(*(long *)local_438.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar4) {
    if (local_3f8.refcount != (int *)0x0) {
      LOCK();
      *local_3f8.refcount = *local_3f8.refcount + -1;
      UNLOCK();
      if (*local_3f8.refcount == 0) {
        if (local_3f8.allocator == (Allocator *)0x0) {
          if (local_3f8.data != (void *)0x0) {
            free(local_3f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_3f8.allocator + 0x18))();
        }
      }
    }
    if (local_3b8.refcount != (int *)0x0) {
      LOCK();
      *local_3b8.refcount = *local_3b8.refcount + -1;
      UNLOCK();
      if (*local_3b8.refcount == 0) {
        if (local_3b8.allocator == (Allocator *)0x0) {
          if (local_3b8.data != (void *)0x0) {
            free(local_3b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_3b8.allocator + 0x18))();
        }
      }
    }
    if (local_378.refcount != (int *)0x0) {
      LOCK();
      *local_378.refcount = *local_378.refcount + -1;
      UNLOCK();
      if (*local_378.refcount == 0) {
        if (local_378.allocator == (Allocator *)0x0) {
          if (local_378.data != (void *)0x0) {
            free(local_378.data);
          }
        }
        else {
          (**(code **)(*(long *)local_378.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar5) {
    if (local_338.refcount != (int *)0x0) {
      LOCK();
      *local_338.refcount = *local_338.refcount + -1;
      UNLOCK();
      if (*local_338.refcount == 0) {
        if (local_338.allocator == (Allocator *)0x0) {
          if (local_338.data != (void *)0x0) {
            free(local_338.data);
          }
        }
        else {
          (**(code **)(*(long *)local_338.allocator + 0x18))();
        }
      }
    }
    if (local_2f8.refcount != (int *)0x0) {
      LOCK();
      *local_2f8.refcount = *local_2f8.refcount + -1;
      UNLOCK();
      if (*local_2f8.refcount == 0) {
        if (local_2f8.allocator == (Allocator *)0x0) {
          if (local_2f8.data != (void *)0x0) {
            free(local_2f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_2f8.allocator + 0x18))();
        }
      }
    }
    if (local_2b8.refcount != (int *)0x0) {
      LOCK();
      *local_2b8.refcount = *local_2b8.refcount + -1;
      UNLOCK();
      if (*local_2b8.refcount == 0) {
        if (local_2b8.allocator == (Allocator *)0x0) {
          if (local_2b8.data != (void *)0x0) {
            free(local_2b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_2b8.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar6) {
    if (local_278.refcount != (int *)0x0) {
      LOCK();
      *local_278.refcount = *local_278.refcount + -1;
      UNLOCK();
      if (*local_278.refcount == 0) {
        if (local_278.allocator == (Allocator *)0x0) {
          if (local_278.data != (void *)0x0) {
            free(local_278.data);
          }
        }
        else {
          (**(code **)(*(long *)local_278.allocator + 0x18))();
        }
      }
    }
    if (local_238.refcount != (int *)0x0) {
      LOCK();
      *local_238.refcount = *local_238.refcount + -1;
      UNLOCK();
      if (*local_238.refcount == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          if (local_238.data != (void *)0x0) {
            free(local_238.data);
          }
        }
        else {
          (**(code **)(*(long *)local_238.allocator + 0x18))();
        }
      }
    }
    if (local_1f8.refcount != (int *)0x0) {
      LOCK();
      *local_1f8.refcount = *local_1f8.refcount + -1;
      UNLOCK();
      if (*local_1f8.refcount == 0) {
        if (local_1f8.allocator == (Allocator *)0x0) {
          if (local_1f8.data != (void *)0x0) {
            free(local_1f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_1f8.allocator + 0x18))();
        }
      }
    }
  }
  if (iVar7 == 0) {
    if (local_1b8.refcount != (int *)0x0) {
      LOCK();
      *local_1b8.refcount = *local_1b8.refcount + -1;
      UNLOCK();
      if (*local_1b8.refcount == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_1b8.allocator + 0x18))();
        }
      }
    }
    if (local_178.refcount != (int *)0x0) {
      LOCK();
      *local_178.refcount = *local_178.refcount + -1;
      UNLOCK();
      if (*local_178.refcount == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (**(code **)(*(long *)local_178.allocator + 0x18))();
        }
      }
    }
    if (local_138.refcount != (int *)0x0) {
      LOCK();
      *local_138.refcount = *local_138.refcount + -1;
      UNLOCK();
      if (*local_138.refcount == 0) {
        if (local_138.allocator == (Allocator *)0x0) {
          if (local_138.data != (void *)0x0) {
            free(local_138.data);
          }
        }
        else {
          (**(code **)(*(long *)local_138.allocator + 0x18))();
        }
      }
    }
  }
  if (local_f8.refcount != (int *)0x0) {
    LOCK();
    *local_f8.refcount = *local_f8.refcount + -1;
    UNLOCK();
    if (*local_f8.refcount == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_f8.allocator + 0x18))();
      }
    }
  }
  if (local_b8.refcount != (int *)0x0) {
    LOCK();
    *local_b8.refcount = *local_b8.refcount + -1;
    UNLOCK();
    if (*local_b8.refcount == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (**(code **)(*(long *)local_78.allocator + 0x18))();
      }
    }
  }
  if (local_678.refcount != (int *)0x0) {
    LOCK();
    *local_678.refcount = *local_678.refcount + -1;
    UNLOCK();
    if (*local_678.refcount == 0) {
      if (local_678.allocator == (Allocator *)0x0) {
        if (local_678.data != (void *)0x0) {
          free(local_678.data);
        }
      }
      else {
        (**(code **)(*(long *)local_678.allocator + 0x18))();
      }
    }
  }
  return uVar9;
}

Assistant:

static int test_crop_4()
{
    ncnn::Mat a = RandomMat(13, 11, 17);

    return 0
        || test_crop(a, IntArrayMat(0, 0, 0), IntArrayMat(100, 100, 100), IntArrayMat(0, 1, 2))
        || test_crop(a, IntArrayMat(4), IntArrayMat(8), IntArrayMat(0))
        || test_crop(a, IntArrayMat(2), IntArrayMat(7), IntArrayMat(1))
        || test_crop(a, IntArrayMat(3), IntArrayMat(5), IntArrayMat(2))
        || test_crop(a, IntArrayMat(2, 1), IntArrayMat(4, -2), IntArrayMat(0, 1))
        || test_crop(a, IntArrayMat(1, 4), IntArrayMat(-5, 7), IntArrayMat(1, -3))
        || test_crop(a, IntArrayMat(2, 1), IntArrayMat(4, -2), IntArrayMat(-1, -2))
        || test_crop(a, IntArrayMat(1, 2, 3), IntArrayMat(-3, -2, -1), IntArrayMat(-3, -2, -1))
        ;
}